

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O0

base_learner * lrqfa_setup(options_i *options,vw *all)

{
  char cVar1;
  vw *pvVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  pointer pLVar6;
  char *__nptr;
  reference pcVar7;
  single_learner *base;
  learner<LRQFAstate,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<LRQFAstate,_example> *l;
  char i;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  int fd_id;
  size_t last_index;
  string lrqopt;
  free_ptr<LRQFAstate> lrq;
  option_group_definition new_options;
  string lrqfa;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc88;
  vw *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  _func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *predict;
  _func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffcb0;
  uint32_t uVar8;
  undefined6 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcde;
  undefined1 in_stack_fffffffffffffcdf;
  option_group_definition *in_stack_fffffffffffffce0;
  string *arg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  string *local_2c8;
  int local_2bc;
  string local_2b8 [32];
  undefined8 local_298;
  string local_290 [32];
  undefined1 local_270 [16];
  undefined4 local_260;
  allocator local_259;
  string local_258 [39];
  undefined1 local_231 [40];
  allocator local_209;
  string local_208 [88];
  learner<char,_char> *in_stack_fffffffffffffe50;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Low Rank Quadratics FA",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc90,
             (string *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"lrqfa",&local_209);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffc98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc90);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(local_208 + 0x20),true);
  arg = (string *)local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_231 + 1),"use low rank quadratic features with field aware weights",
             (allocator *)arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffffc90,(string *)in_stack_fffffffffffffc88);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffffce0,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffcdf,
                         CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string((string *)(local_231 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_231);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  (**(code **)*local_10)(local_10,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"lrqfa",&local_259);
  bVar3 = (**(code **)(*local_10 + 8))(local_10,local_258);
  bVar3 = bVar3 ^ 0xff;
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  if ((bVar3 & 1) == 0) {
    scoped_calloc_or_throw<LRQFAstate>();
    pvVar2 = local_18;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da5fe);
    pLVar6->all = pvVar2;
    spoof_hex_encoded_namespaces(arg);
    local_298 = std::__cxx11::string::find_last_not_of((char *)local_290,0x3e572e);
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da652);
    std::__cxx11::string::substr((ulong)&pLVar6->field_name,(ulong)local_290);
    std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_290);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar5 = atoi(__nptr);
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da6c3);
    pLVar6->k = iVar5;
    std::__cxx11::string::~string(local_2b8);
    local_2bc = 0;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da6ef);
    local_2c8 = &pLVar6->field_name;
    local_2d0._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc88);
      if (!bVar4) break;
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_2d0);
      iVar5 = local_2bc;
      cVar1 = *pcVar7;
      local_2bc = local_2bc + 1;
      pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                         ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da77b);
      pLVar6->field_id[(int)cVar1] = iVar5;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_2d0);
    }
    uVar8 = local_18->wpp;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da7fb);
    local_18->wpp = uVar8 * (pLVar6->k + 1);
    setup_base((options_i *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    base = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffe50);
    predict = (_func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *)local_270;
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da854);
    in_stack_fffffffffffffc90 = (vw *)std::__cxx11::string::size();
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2da86f);
    base_00 = LEARNER::init_learner<LRQFAstate,example,LEARNER::learner<char,example>>
                        ((free_ptr<LRQFAstate> *)CONCAT44(uVar8,in_stack_fffffffffffffcb0),base,
                         in_stack_fffffffffffffca0,predict,(size_t)in_stack_fffffffffffffc90);
    local_8 = LEARNER::make_base<LRQFAstate,example>(base_00);
    local_260 = 1;
    std::__cxx11::string::~string(local_290);
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)base_00);
  }
  else {
    local_8 = (base_learner *)0x0;
    local_260 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LEARNER::base_learner* lrqfa_setup(options_i& options, vw& all)
{
  std::string lrqfa;
  option_group_definition new_options("Low Rank Quadratics FA");
  new_options.add(make_option("lrqfa", lrqfa).keep().help("use low rank quadratic features with field aware weights"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrqfa"))
    return nullptr;

  auto lrq = scoped_calloc_or_throw<LRQFAstate>();
  lrq->all = &all;

  string lrqopt = spoof_hex_encoded_namespaces(lrqfa);
  size_t last_index = lrqopt.find_last_not_of("0123456789");
  new (&lrq->field_name) string(lrqopt.substr(0, last_index + 1));  // make sure there is no duplicates
  lrq->k = atoi(lrqopt.substr(last_index + 1).c_str());

  int fd_id = 0;
  for (char i : lrq->field_name) lrq->field_id[(int)i] = fd_id++;

  all.wpp = all.wpp * (uint64_t)(1 + lrq->k);
  learner<LRQFAstate, example>& l = init_learner(lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>,
      predict_or_learn<false>, 1 + lrq->field_name.size() * lrq->k);

  return make_base(l);
}